

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailure_BinaryEqualWithText_Test::testBody(TEST_TestFailure_BinaryEqualWithText_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  uchar actualData [1];
  uchar expectedData [1];
  undefined1 local_98 [16];
  BinaryEqualFailure f;
  
  expectedData[0] = '\0';
  actualData[0] = '\x01';
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_98,"text");
  BinaryEqualFailure::BinaryEqualFailure
            (&f,pUVar1,"fail.cpp",2,expectedData,actualData,1,(SimpleString *)local_98);
  SimpleString::~SimpleString((SimpleString *)local_98);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_98);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_98);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "Message: text\n\texpected <00>\n\tbut was  <01>\n\tdifference starts at position 0 at: <         01         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x13f,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_98);
  TestFailure::~TestFailure(&f.super_TestFailure);
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualWithText)
{
    const unsigned char expectedData[] = { 0x00 };
    const unsigned char actualData[] = { 0x01 };
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <00>\n"
                  "\tbut was  <01>\n"
                  "\tdifference starts at position 0 at: <         01         >\n"
                  "\t                                               ^", f);
}